

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O1

void ConvertBGRAToRGBA4444_SSE2(uint32_t *src,int num_pixels,uint8_t *dst)

{
  undefined1 (*pauVar1) [16];
  uint uVar2;
  bool bVar3;
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [15];
  unkuint9 Var23;
  undefined1 auVar24 [11];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 *puVar27;
  undefined1 (*pauVar28) [16];
  undefined1 (*pauVar29) [16];
  undefined1 (*pauVar30) [16];
  undefined1 (*pauVar31) [16];
  undefined1 (*pauVar32) [16];
  undefined1 (*pauVar33) [16];
  undefined1 (*pauVar34) [16];
  undefined1 (*pauVar35) [16];
  undefined1 (*pauVar36) [16];
  undefined1 (*pauVar37) [16];
  undefined1 (*pauVar38) [16];
  undefined1 (*pauVar39) [16];
  undefined1 (*pauVar40) [16];
  undefined1 (*pauVar41) [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  __m128i *out;
  int iVar44;
  __m128i *in;
  byte bVar53;
  byte bVar54;
  byte bVar55;
  byte bVar56;
  byte bVar57;
  byte bVar58;
  byte bVar59;
  undefined1 auVar45 [16];
  byte bVar60;
  undefined1 auVar61 [12];
  short sVar72;
  short sVar73;
  short sVar74;
  undefined1 auVar63 [16];
  undefined1 auVar71 [16];
  ushort uVar75;
  ushort uVar86;
  ushort uVar87;
  byte bVar89;
  ushort uVar88;
  undefined1 auVar76 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar62 [14];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  
  auVar43 = _DAT_0012b7e0;
  auVar42 = _DAT_0012b7d0;
  iVar44 = num_pixels;
  if (7 < num_pixels) {
    do {
      auVar85 = *(undefined1 (*) [16])src;
      pauVar1 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar28 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar29 = (undefined1 (*) [16])((long)src + 0x10);
      uVar11 = (*(undefined1 (*) [16])((long)src + 0x10))[3];
      pauVar30 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar31 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar32 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar33 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar34 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar35 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar36 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar37 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar38 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar39 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar40 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar41 = (undefined1 (*) [16])((long)src + 0x10);
      src = (uint32_t *)((long)src + 0x20);
      auVar83._0_14_ = auVar85._0_14_;
      auVar83[0xe] = auVar85[7];
      auVar83[0xf] = (*pauVar33)[7];
      auVar82._14_2_ = auVar83._14_2_;
      auVar82._0_13_ = auVar85._0_13_;
      auVar82[0xd] = (*pauVar32)[6];
      auVar81._13_3_ = auVar82._13_3_;
      auVar81._0_12_ = auVar85._0_12_;
      auVar81[0xc] = auVar85[6];
      auVar80._12_4_ = auVar81._12_4_;
      auVar80._0_11_ = auVar85._0_11_;
      auVar80[0xb] = (*pauVar31)[5];
      auVar79._11_5_ = auVar80._11_5_;
      auVar79._0_10_ = auVar85._0_10_;
      auVar79[10] = auVar85[5];
      auVar78._10_6_ = auVar79._10_6_;
      auVar78._0_9_ = auVar85._0_9_;
      auVar78[9] = (*pauVar30)[4];
      auVar77._9_7_ = auVar78._9_7_;
      auVar77._0_8_ = auVar85._0_8_;
      auVar77[8] = auVar85[4];
      auVar16._1_8_ = auVar77._8_8_;
      auVar16[0] = uVar11;
      auVar16._9_7_ = 0;
      auVar15._10_6_ = 0;
      auVar15._0_10_ = SUB1610(auVar16 << 0x38,6);
      auVar14._11_5_ = 0;
      auVar14._0_11_ = SUB1611(auVar15 << 0x30,5);
      auVar13._12_4_ = 0;
      auVar13._0_12_ = SUB1612(auVar14 << 0x28,4);
      auVar12._13_3_ = 0;
      auVar12._0_13_ = SUB1613(auVar13 << 0x20,3);
      auVar76._14_2_ = 0;
      auVar76._0_14_ = SUB1614(auVar12 << 0x18,2);
      auVar76 = auVar76 << 0x10;
      auVar70._0_14_ = auVar76._0_14_;
      auVar70[0xe] = uVar11;
      auVar70[0xf] = (*pauVar37)[0xb];
      auVar69._14_2_ = auVar70._14_2_;
      auVar69._0_13_ = auVar76._0_13_;
      auVar69[0xd] = auVar85[0xb];
      auVar68._13_3_ = auVar69._13_3_;
      auVar68._0_12_ = auVar76._0_12_;
      auVar68[0xc] = auVar85[3];
      auVar67._12_4_ = auVar68._12_4_;
      auVar67._0_11_ = auVar76._0_11_;
      auVar67[0xb] = (*pauVar36)[10];
      auVar66._11_5_ = auVar67._11_5_;
      auVar66._0_10_ = auVar76._0_10_;
      auVar66[10] = (*pauVar29)[2];
      auVar65._10_6_ = auVar66._10_6_;
      auVar65._0_9_ = auVar76._0_9_;
      auVar65[9] = auVar85[10];
      auVar64._9_7_ = auVar65._9_7_;
      auVar64._0_8_ = auVar76._0_8_;
      auVar64[8] = auVar85[2];
      auVar21._1_8_ = auVar64._8_8_;
      auVar21[0] = (*pauVar35)[9];
      auVar21._9_7_ = 0;
      auVar20._10_6_ = 0;
      auVar20._0_10_ = SUB1610(auVar21 << 0x38,6);
      auVar19._11_5_ = 0;
      auVar19._0_11_ = SUB1611(auVar20 << 0x30,5);
      auVar18._12_4_ = 0;
      auVar18._0_12_ = SUB1612(auVar19 << 0x28,4);
      auVar17._13_3_ = 0;
      auVar17._0_13_ = SUB1613(auVar18 << 0x20,3);
      auVar63._14_2_ = 0;
      auVar63._0_14_ = SUB1614(auVar17 << 0x18,2);
      auVar63 = auVar63 << 0x10;
      auVar52._0_14_ = auVar63._0_14_;
      auVar52[0xe] = (*pauVar35)[9];
      auVar52[0xf] = (*pauVar39)[0xd];
      auVar51._14_2_ = auVar52._14_2_;
      auVar51._0_13_ = auVar63._0_13_;
      auVar51[0xd] = (*pauVar31)[5];
      auVar50._13_3_ = auVar51._13_3_;
      auVar50._0_12_ = auVar63._0_12_;
      auVar50[0xc] = (*pauVar28)[1];
      auVar49._12_4_ = auVar50._12_4_;
      auVar49._0_11_ = auVar63._0_11_;
      auVar49[0xb] = auVar85[0xd];
      auVar48._11_5_ = auVar49._11_5_;
      auVar48._0_10_ = auVar63._0_10_;
      auVar48[10] = auVar85[9];
      auVar47._10_6_ = auVar48._10_6_;
      auVar47._0_9_ = auVar63._0_9_;
      auVar47[9] = auVar85[5];
      auVar46._9_7_ = auVar47._9_7_;
      auVar46._0_8_ = auVar63._0_8_;
      auVar46[8] = auVar85[1];
      auVar45._8_8_ = auVar46._8_8_;
      auVar45[7] = (*pauVar38)[0xc];
      auVar45[6] = (*pauVar34)[8];
      auVar45[5] = (*pauVar30)[4];
      auVar45[4] = (*pauVar1)[0];
      auVar45[3] = auVar85[0xc];
      auVar45[2] = auVar85[8];
      auVar45[1] = auVar85[4];
      auVar45[0] = auVar85[0];
      auVar71._0_8_ =
           CONCAT17((*pauVar40)[0xe],
                    CONCAT16((*pauVar36)[10],
                             CONCAT15((*pauVar32)[6],
                                      CONCAT14((*pauVar29)[2],
                                               CONCAT13(auVar85[0xe],
                                                        CONCAT12(auVar85[10],
                                                                 CONCAT11(auVar85[6],auVar85[2])))))
                            ));
      auVar61._0_10_ = CONCAT19(auVar85[7],CONCAT18(auVar85[3],auVar71._0_8_));
      auVar61[10] = auVar85[0xb];
      auVar61[0xb] = auVar85[0xf];
      auVar62[0xc] = uVar11;
      auVar62._0_12_ = auVar61;
      auVar62[0xd] = (*pauVar33)[7];
      auVar85[0xe] = (*pauVar37)[0xb];
      auVar85._0_14_ = auVar62;
      auVar85[0xf] = (*pauVar41)[0xf];
      auVar71._8_8_ = auVar45._0_8_;
      auVar84._0_2_ = auVar46._8_2_ >> 4;
      auVar84._2_2_ = auVar48._10_2_ >> 4;
      auVar84._4_2_ = auVar50._12_2_ >> 4;
      auVar84._6_2_ = auVar51._14_2_ >> 4;
      auVar84._8_2_ = (ushort)((unkuint10)auVar61._0_10_ >> 0x44);
      auVar84._10_2_ = auVar61._10_2_ >> 4;
      auVar84._12_2_ = auVar62._12_2_ >> 4;
      auVar84._14_2_ = auVar85._14_2_ >> 4;
      auVar85 = auVar84 & auVar43 | auVar71 & auVar42;
      bVar53 = auVar85[8];
      bVar54 = auVar85[9];
      bVar55 = auVar85[10];
      bVar56 = auVar85[0xb];
      bVar57 = auVar85[0xc];
      bVar58 = auVar85[0xd];
      bVar59 = auVar85[0xe];
      bVar60 = auVar85[0xf];
      bVar89 = auVar85[7];
      auVar4[0xd] = 0;
      auVar4._0_13_ = auVar85._0_13_;
      auVar4[0xe] = bVar89;
      auVar5[0xc] = auVar85[6];
      auVar5._0_12_ = auVar85._0_12_;
      auVar5._13_2_ = auVar4._13_2_;
      auVar6[0xb] = 0;
      auVar6._0_11_ = auVar85._0_11_;
      auVar6._12_3_ = auVar5._12_3_;
      auVar7[10] = auVar85[5];
      auVar7._0_10_ = auVar85._0_10_;
      auVar7._11_4_ = auVar6._11_4_;
      auVar8[9] = 0;
      auVar8._0_9_ = auVar85._0_9_;
      auVar8._10_5_ = auVar7._10_5_;
      auVar9[8] = auVar85[4];
      auVar9._0_8_ = auVar85._0_8_;
      auVar9._9_6_ = auVar8._9_6_;
      auVar22._7_8_ = 0;
      auVar22._0_7_ = auVar9._8_7_;
      Var23 = CONCAT81(SUB158(auVar22 << 0x40,7),auVar85[3]);
      auVar25._9_6_ = 0;
      auVar25._0_9_ = Var23;
      auVar24._1_10_ = SUB1510(auVar25 << 0x30,5);
      auVar24[0] = auVar85[2];
      auVar26._11_4_ = 0;
      auVar26._0_11_ = auVar24;
      auVar10[2] = auVar85[1];
      auVar10._0_2_ = auVar85._0_2_;
      auVar10._3_12_ = SUB1512(auVar26 << 0x20,3);
      uVar75 = auVar85._0_2_ & 0xff;
      sVar72 = auVar9._8_2_;
      sVar73 = auVar7._10_2_;
      sVar74 = auVar5._12_2_;
      uVar88 = (ushort)Var23;
      uVar87 = auVar24._0_2_;
      uVar86 = auVar10._2_2_;
      *dst = ((auVar85 & (undefined1  [16])0xff) != (undefined1  [16])0x0) * (uVar75 < 0x100) *
             auVar85[0] - (0xff < uVar75);
      dst[1] = (bVar53 != 0) * (bVar53 < 0x100) * bVar53 - (0xff < bVar53);
      dst[2] = (uVar86 != 0) * (uVar86 < 0x100) * auVar85[1] - (0xff < uVar86);
      dst[3] = (bVar54 != 0) * (bVar54 < 0x100) * bVar54 - (0xff < bVar54);
      dst[4] = (uVar87 != 0) * (uVar87 < 0x100) * auVar85[2] - (0xff < uVar87);
      dst[5] = (bVar55 != 0) * (bVar55 < 0x100) * bVar55 - (0xff < bVar55);
      dst[6] = (uVar88 != 0) * (uVar88 < 0x100) * auVar85[3] - (0xff < uVar88);
      dst[7] = (bVar56 != 0) * (bVar56 < 0x100) * bVar56 - (0xff < bVar56);
      dst[8] = (0 < sVar72) * (sVar72 < 0x100) * auVar85[4] - (0xff < sVar72);
      dst[9] = (bVar57 != 0) * (bVar57 < 0x100) * bVar57 - (0xff < bVar57);
      dst[10] = (0 < sVar73) * (sVar73 < 0x100) * auVar85[5] - (0xff < sVar73);
      dst[0xb] = (bVar58 != 0) * (bVar58 < 0x100) * bVar58 - (0xff < bVar58);
      dst[0xc] = (0 < sVar74) * (sVar74 < 0x100) * auVar85[6] - (0xff < sVar74);
      dst[0xd] = (bVar59 != 0) * (bVar59 < 0x100) * bVar59 - (0xff < bVar59);
      dst[0xe] = (bVar89 != 0) * (bVar89 < 0x100) * bVar89 - (0xff < bVar89);
      dst[0xf] = (bVar60 != 0) * (bVar60 < 0x100) * bVar60 - (0xff < bVar60);
      dst = dst + 0x10;
      num_pixels = iVar44 + -8;
      bVar3 = 0xf < iVar44;
      iVar44 = num_pixels;
    } while (bVar3);
  }
  if (0 < num_pixels) {
    if (0 < num_pixels) {
      puVar27 = *(undefined1 (*) [16])src;
      do {
        uVar2 = *(uint *)*(undefined1 (*) [16])src;
        src = (uint32_t *)(*(undefined1 (*) [16])src + 4);
        *dst = (byte)(uVar2 >> 0xc) & 0xf | (byte)(uVar2 >> 0x10) & 0xf0;
        dst[1] = (byte)(uVar2 >> 0x1c) | (byte)uVar2 & 0xf0;
        dst = dst + 2;
      } while (src < (undefined1 (*) [16])(puVar27 + (long)num_pixels * 4));
    }
    return;
  }
  return;
}

Assistant:

static void ConvertBGRAToRGBA4444_SSE2(const uint32_t* src,
                                       int num_pixels, uint8_t* dst) {
  const __m128i mask_0x0f = _mm_set1_epi8(0x0f);
  const __m128i mask_0xf0 = _mm_set1_epi8(0xf0);
  const __m128i* in = (const __m128i*)src;
  __m128i* out = (__m128i*)dst;
  while (num_pixels >= 8) {
    const __m128i bgra0 = _mm_loadu_si128(in++);     // bgra0|bgra1|bgra2|bgra3
    const __m128i bgra4 = _mm_loadu_si128(in++);     // bgra4|bgra5|bgra6|bgra7
    const __m128i v0l = _mm_unpacklo_epi8(bgra0, bgra4);  // b0b4g0g4r0r4a0a4...
    const __m128i v0h = _mm_unpackhi_epi8(bgra0, bgra4);  // b2b6g2g6r2r6a2a6...
    const __m128i v1l = _mm_unpacklo_epi8(v0l, v0h);    // b0b2b4b6g0g2g4g6...
    const __m128i v1h = _mm_unpackhi_epi8(v0l, v0h);    // b1b3b5b7g1g3g5g7...
    const __m128i v2l = _mm_unpacklo_epi8(v1l, v1h);    // b0...b7 | g0...g7
    const __m128i v2h = _mm_unpackhi_epi8(v1l, v1h);    // r0...r7 | a0...a7
    const __m128i ga0 = _mm_unpackhi_epi64(v2l, v2h);   // g0...g7 | a0...a7
    const __m128i rb0 = _mm_unpacklo_epi64(v2h, v2l);   // r0...r7 | b0...b7
    const __m128i ga1 = _mm_srli_epi16(ga0, 4);         // g0-|g1-|...|a6-|a7-
    const __m128i rb1 = _mm_and_si128(rb0, mask_0xf0);  // -r0|-r1|...|-b6|-a7
    const __m128i ga2 = _mm_and_si128(ga1, mask_0x0f);  // g0-|g1-|...|a6-|a7-
    const __m128i rgba0 = _mm_or_si128(ga2, rb1);       // rg0..rg7 | ba0..ba7
    const __m128i rgba1 = _mm_srli_si128(rgba0, 8);     // ba0..ba7 | 0
#if (WEBP_SWAP_16BIT_CSP == 1)
    const __m128i rgba = _mm_unpacklo_epi8(rgba1, rgba0);  // barg0...barg7
#else
    const __m128i rgba = _mm_unpacklo_epi8(rgba0, rgba1);  // rgba0...rgba7
#endif
    _mm_storeu_si128(out++, rgba);
    num_pixels -= 8;
  }
  // left-overs
  if (num_pixels > 0) {
    VP8LConvertBGRAToRGBA4444_C((const uint32_t*)in, num_pixels, (uint8_t*)out);
  }
}